

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::GlassMaterial::readFrom(GlassMaterial *this,BinaryReader *binary)

{
  BinaryReader *in_RSI;
  vec3f *in_RDI;
  
  Material::readFrom(&this->super_Material,binary);
  BinaryReader::read<pbrt::math::vec3f,void>(in_RSI,in_RDI);
  BinaryReader::read<pbrt::math::vec3f,void>(in_RSI,in_RDI);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  return;
}

Assistant:

void GlassMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(kr);
    binary.read(kt);
    binary.read(index);
  }